

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::CleanTemporaryDirectory(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  long *plVar2;
  bool bVar3;
  char *__s;
  ostream *poVar4;
  size_t sVar5;
  int iVar6;
  string tempInstallDirectory;
  ostringstream cmCPackLog_msg;
  long *local_1d8 [2];
  long local_1c8 [2];
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
  __s = GetOption(this,(string *)local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,__s,(allocator<char> *)local_1d8);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&local_1b8);
  iVar6 = 1;
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"- Clean temporary : ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar2 = local_1d8[0];
    sVar5 = strlen((char *)local_1d8[0]);
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x4ef,(char *)plVar2,sVar5);
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    bVar3 = cmSystemTools::RepeatedRemoveDirectory(&local_1b8);
    iVar6 = 1;
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Problem removing temporary directory: ",0x26);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length
                         );
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      plVar2 = local_1d8[0];
      sVar5 = strlen((char *)local_1d8[0]);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f3,(char *)plVar2,sVar5);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      iVar6 = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackGenerator::CleanTemporaryDirectory()
{
  std::string tempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  if (cmsys::SystemTools::FileExists(tempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Clean temporary : " << tempInstallDirectory << std::endl);
    if (!cmSystemTools::RepeatedRemoveDirectory(tempInstallDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem removing temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }
  }
  return 1;
}